

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O3

int ply_read_header(p_ply_conflict ply)

{
  int iVar1;
  uint uVar2;
  ushort **ppuVar3;
  t_ply_idriver_conflict *ptVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  int i;
  e_ply_storage_mode eVar8;
  long lVar9;
  int i_1;
  undefined8 local_38;
  
  iVar1 = BREFILL(ply);
  if (iVar1 == 0) {
    pcVar6 = "Unable to read magic number from file";
  }
  else {
    if (((ply->buffer[0] == 'p') && (ply->buffer[1] == 'l')) && (ply->buffer[2] == 'y')) {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (long)ply->buffer[3] * 2 + 1) & 0x20) != 0) {
        uVar2 = 0;
        if (ply->buffer[3] == '\r') {
          uVar2 = (uint)(ply->buffer[4] == '\n');
        }
        ply->rn = uVar2;
        ply->buffer_first = ply->buffer_first + 3;
        iVar1 = ply_read_word(ply);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = strcmp(ply->buffer + ply->buffer_token,"format");
        if ((iVar1 == 0) && (iVar1 = ply_read_word(ply), iVar1 != 0)) {
          sVar5 = ply->buffer_token;
          pcVar6 = "binary_big_endian";
          lVar9 = 0;
          do {
            iVar1 = strcmp(pcVar6,ply->buffer + sVar5);
            if (iVar1 == 0) {
              eVar8 = (e_ply_storage_mode)lVar9;
              ply->storage_mode = eVar8;
              if (eVar8 != ~PLY_BIG_ENDIAN) {
                if (eVar8 == PLY_ASCII) {
                  ptVar4 = &ply_idriver_ascii;
                }
                else if (eVar8 == PLY_LITTLE_ENDIAN) {
                  ptVar4 = &ply_idriver_binary;
                }
                else {
                  ptVar4 = &ply_idriver_binary_reverse;
                }
                ply->idriver = ptVar4;
                iVar1 = ply_read_word(ply);
                if (((iVar1 != 0) &&
                    (iVar1 = strcmp(ply->buffer + ply->buffer_token,"1.0"), iVar1 == 0)) &&
                   (iVar1 = ply_read_word(ply), iVar1 != 0)) {
                  iVar1 = strcmp(ply->buffer + ply->buffer_token,"end_header");
                  if (iVar1 != 0) {
                    do {
                      iVar1 = ply_read_header_comment(ply);
                      if (iVar1 == 0) {
                        iVar1 = strcmp(ply->buffer + ply->buffer_token,"element");
                        if ((iVar1 == 0) &&
                           (pcVar6 = (char *)ply_grow_array(ply,&ply->element,&ply->nelements,0x118)
                           , pcVar6 != (char *)0x0)) {
                          *pcVar6 = '\0';
                          pcVar6[0x100] = '\0';
                          pcVar6[0x101] = '\0';
                          pcVar6[0x102] = '\0';
                          pcVar6[0x103] = '\0';
                          pcVar6[0x104] = '\0';
                          pcVar6[0x105] = '\0';
                          pcVar6[0x106] = '\0';
                          pcVar6[0x107] = '\0';
                          pcVar6[0x108] = '\0';
                          pcVar6[0x109] = '\0';
                          pcVar6[0x10a] = '\0';
                          pcVar6[0x10b] = '\0';
                          pcVar6[0x10c] = '\0';
                          pcVar6[0x10d] = '\0';
                          pcVar6[0x10e] = '\0';
                          pcVar6[0x10f] = '\0';
                          pcVar6[0x110] = '\0';
                          pcVar6[0x111] = '\0';
                          pcVar6[0x112] = '\0';
                          pcVar6[0x113] = '\0';
                          pcVar6[0x114] = '\0';
                          pcVar6[0x115] = '\0';
                          pcVar6[0x116] = '\0';
                          pcVar6[0x117] = '\0';
                          iVar1 = ply_read_word(ply);
                          if (iVar1 != 0) {
                            strcpy(pcVar6,ply->buffer + ply->buffer_token);
                            iVar1 = ply_read_word(ply);
                            if (iVar1 != 0) {
                              iVar1 = __isoc99_sscanf(ply->buffer + ply->buffer_token,"%ld",
                                                      &local_38);
                              if (iVar1 == 1) {
                                *(undefined8 *)(pcVar6 + 0x100) = local_38;
                                iVar1 = ply_read_word(ply);
                                if (iVar1 != 0) {
LAB_00122200:
                                  iVar1 = strcmp(ply->buffer + ply->buffer_token,"property");
                                  if ((iVar1 == 0) &&
                                     (pcVar6 = (char *)ply_grow_array(ply,&ply->element
                                                                           [ply->nelements + -1].
                                                                           property,
                                                                      &ply->element
                                                                       [ply->nelements + -1].
                                                                       nproperties,0x128),
                                     pcVar6 != (char *)0x0)) {
                                    *pcVar6 = '\0';
                                    pcVar6[0x100] = -1;
                                    pcVar6[0x101] = -1;
                                    pcVar6[0x102] = -1;
                                    pcVar6[0x103] = -1;
                                    pcVar6[0x104] = -1;
                                    pcVar6[0x105] = -1;
                                    pcVar6[0x106] = -1;
                                    pcVar6[0x107] = -1;
                                    pcVar6[0x108] = -1;
                                    pcVar6[0x109] = -1;
                                    pcVar6[0x10a] = -1;
                                    pcVar6[0x10b] = -1;
                                    pcVar6[0x110] = '\0';
                                    pcVar6[0x111] = '\0';
                                    pcVar6[0x112] = '\0';
                                    pcVar6[0x113] = '\0';
                                    pcVar6[0x114] = '\0';
                                    pcVar6[0x115] = '\0';
                                    pcVar6[0x116] = '\0';
                                    pcVar6[0x117] = '\0';
                                    pcVar6[0x118] = '\0';
                                    pcVar6[0x119] = '\0';
                                    pcVar6[0x11a] = '\0';
                                    pcVar6[0x11b] = '\0';
                                    pcVar6[0x11c] = '\0';
                                    pcVar6[0x11d] = '\0';
                                    pcVar6[0x11e] = '\0';
                                    pcVar6[0x11f] = '\0';
                                    pcVar6[0x120] = '\0';
                                    pcVar6[0x121] = '\0';
                                    pcVar6[0x122] = '\0';
                                    pcVar6[0x123] = '\0';
                                    pcVar6[0x124] = '\0';
                                    pcVar6[0x125] = '\0';
                                    pcVar6[0x126] = '\0';
                                    pcVar6[0x127] = '\0';
                                    iVar1 = ply_read_word(ply);
                                    if (iVar1 != 0) {
                                      sVar5 = ply->buffer_token;
                                      lVar9 = 0;
                                      pcVar7 = "int8";
                                      do {
                                        iVar1 = strcmp(pcVar7,ply->buffer + sVar5);
                                        if (iVar1 == 0) {
                                          iVar1 = (int)lVar9;
                                          *(int *)(pcVar6 + 0x100) = iVar1;
                                          if (iVar1 == -1) goto LAB_00122216;
                                          if (iVar1 != 0x10) goto LAB_001223c3;
                                          iVar1 = ply_read_word(ply);
                                          if (iVar1 == 0) goto LAB_00122216;
                                          sVar5 = ply->buffer_token;
                                          lVar9 = 0;
                                          pcVar7 = "int8";
                                          goto LAB_0012232e;
                                        }
                                        pcVar7 = ply_type_list[lVar9 + 1];
                                        lVar9 = lVar9 + 1;
                                      } while (lVar9 != 0x11);
                                      pcVar6[0x100] = -1;
                                      pcVar6[0x101] = -1;
                                      pcVar6[0x102] = -1;
                                      pcVar6[0x103] = -1;
                                    }
                                  }
                                  goto LAB_00122216;
                                }
                              }
                              else {
                                ply_ferror(ply,"Expected number got \'%s\'",
                                           ply->buffer + ply->buffer_token);
                              }
                            }
                          }
                        }
                        iVar1 = ply_read_header_obj_info(ply);
                        if (iVar1 == 0) {
                          ply_ferror(ply,"Unexpected token \'%s\'",ply->buffer + ply->buffer_token);
                          return 0;
                        }
                      }
LAB_0012212e:
                      iVar1 = strcmp(ply->buffer + ply->buffer_token,"end_header");
                    } while (iVar1 != 0);
                  }
                  if (ply->rn == 0) {
                    return 1;
                  }
                  sVar5 = ply->buffer_first;
                  if (ply->buffer_last != sVar5) {
LAB_00122461:
                    ply->buffer_first = sVar5 + 1;
                    return 1;
                  }
                  iVar1 = BREFILL(ply);
                  if (iVar1 != 0) {
                    sVar5 = ply->buffer_first;
                    goto LAB_00122461;
                  }
                  pcVar6 = "Unexpected end of file";
                  goto LAB_00121ff1;
                }
              }
              goto LAB_00121fea;
            }
            pcVar6 = ply_storage_mode_list[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          ply->storage_mode = ~PLY_BIG_ENDIAN;
        }
LAB_00121fea:
        pcVar6 = "Invalid file format";
LAB_00121ff1:
        ply_ferror(ply,pcVar6);
        return 0;
      }
    }
    pcVar6 = "Wrong magic number. Expected \'ply\'";
  }
  (*ply->error_cb)(ply,pcVar6);
  return 0;
  while( true ) {
    pcVar7 = ply_type_list[lVar9 + 1];
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x11) break;
LAB_0012232e:
    iVar1 = strcmp(pcVar7,ply->buffer + sVar5);
    if (iVar1 == 0) {
      *(int *)(pcVar6 + 0x108) = (int)lVar9;
      iVar1 = ply_read_word(ply);
      if (iVar1 == 0) goto LAB_00122216;
      sVar5 = ply->buffer_token;
      lVar9 = 0;
      pcVar7 = "int8";
      goto LAB_00122389;
    }
  }
  pcVar6[0x108] = -1;
  pcVar6[0x109] = -1;
  pcVar6[0x10a] = -1;
  pcVar6[0x10b] = -1;
  goto LAB_00122216;
LAB_00122389:
  iVar1 = strcmp(pcVar7,ply->buffer + sVar5);
  if (iVar1 != 0) goto code_r0x00122395;
  *(int *)(pcVar6 + 0x104) = (int)lVar9;
LAB_001223c3:
  iVar1 = ply_read_word(ply);
  if (iVar1 != 0) {
    strcpy(pcVar6,ply->buffer + ply->buffer_token);
    iVar1 = ply_read_word(ply);
    if (iVar1 == 0) goto LAB_00122216;
    goto LAB_00122200;
  }
LAB_00122216:
  iVar1 = ply_read_header_comment(ply);
  if ((iVar1 != 0) || (iVar1 = ply_read_header_obj_info(ply), iVar1 != 0)) goto LAB_00122200;
  goto LAB_0012212e;
code_r0x00122395:
  pcVar7 = ply_type_list[lVar9 + 1];
  lVar9 = lVar9 + 1;
  if (lVar9 == 0x11) goto code_r0x001223a3;
  goto LAB_00122389;
code_r0x001223a3:
  pcVar6[0x104] = -1;
  pcVar6[0x105] = -1;
  pcVar6[0x106] = -1;
  pcVar6[0x107] = -1;
  goto LAB_00122216;
}

Assistant:

int ply_read_header(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (!ply_read_header_magic(ply)) return 0;
    if (!ply_read_word(ply)) return 0;
    /* parse file format */
    if (!ply_read_header_format(ply)) {
        ply_ferror(ply, "Invalid file format");
        return 0;
    }
    /* parse elements, comments or obj_infos until the end of header */
    while (strcmp(BWORD(ply), "end_header")) {
        if (!ply_read_header_comment(ply) &&
                !ply_read_header_element(ply) &&
                !ply_read_header_obj_info(ply)) {
            ply_ferror(ply, "Unexpected token '%s'", BWORD(ply));
            return 0;
        }
    }
    /* skip extra character? */
    if (ply->rn) {
        if (BSIZE(ply) < 1 && !BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
        BSKIP(ply, 1);
    }
    return 1;
}